

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O2

report * __thiscall
picobench::runner::generate_report<std::equal_to<long>>(report *__return_storage_ptr__,runner *this)

{
  pointer prVar1;
  pointer puVar2;
  benchmark_impl *pbVar3;
  uint *puVar4;
  pointer psVar5;
  pointer pbVar6;
  pointer psVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  pointer psVar13;
  pointer prVar14;
  uint *puVar15;
  benchmark_problem_space *d;
  vector<int,_std::allocator<int>_> *pvVar16;
  pointer pbVar17;
  _Base_ptr p_Var18;
  pointer pbVar19;
  unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> *b;
  pointer puVar20;
  state *state;
  pointer psVar21;
  map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
  psview;
  
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->suites).
           super__Vector_base<picobench::report::suite,_std::allocator<picobench::report::suite>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->suites).
           super__Vector_base<picobench::report::suite,_std::allocator<picobench::report::suite>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (__return_storage_ptr__->suites).
  super__Vector_base<picobench::report::suite,_std::allocator<picobench::report::suite>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->suites).
  super__Vector_base<picobench::report::suite,_std::allocator<picobench::report::suite>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>::resize
            (&__return_storage_ptr__->suites,
             (long)(this->super_registry)._suites.
                   super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(this->super_registry)._suites.
                   super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl
                   .super__Vector_impl_data._M_start >> 5);
  psVar13 = (__return_storage_ptr__->suites).
            super__Vector_base<picobench::report::suite,_std::allocator<picobench::report::suite>_>.
            _M_impl.super__Vector_impl_data._M_start;
  prVar1 = (this->super_registry)._suites.
           super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (prVar14 = (this->super_registry)._suites.
                 super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
                 super__Vector_impl_data._M_start; prVar14 != prVar1; prVar14 = prVar14 + 1) {
    psVar13->name = prVar14->name;
    std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>::resize
              (&psVar13->benchmarks,
               (long)(prVar14->benchmarks).
                     super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(prVar14->benchmarks).
                     super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    pbVar19 = (psVar13->benchmarks).
              super__Vector_base<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (prVar14->benchmarks).
             super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar20 = (prVar14->benchmarks).
                   super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar20 != puVar2;
        puVar20 = puVar20 + 1) {
      pbVar19->name =
           (((puVar20->_M_t).
             super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
             .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl)->
           super_benchmark)._name;
      pbVar3 = (puVar20->_M_t).
               super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
               .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl;
      pbVar19->is_baseline = (pbVar3->super_benchmark)._baseline;
      pvVar16 = &(pbVar3->super_benchmark)._state_iterations;
      if (*(pointer *)
           &(pbVar3->super_benchmark)._state_iterations.
            super__Vector_base<int,_std::allocator<int>_>._M_impl ==
          *(pointer *)((long)&(pbVar3->super_benchmark)._state_iterations + 8)) {
        pvVar16 = &this->_default_state_iterations;
      }
      std::
      vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
      ::reserve(&pbVar19->data,
                (long)(pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2);
      puVar4 = (uint *)(pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
      for (puVar15 = (uint *)(pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start; puVar15 != puVar4;
          puVar15 = puVar15 + 1) {
        psview._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        psview._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        psview._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        psview._M_t._M_impl._4_4_ = 0;
        psview._M_t._M_impl._0_4_ = *puVar15;
        std::
        vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
        ::emplace_back<picobench::report::benchmark_problem_space>
                  (&pbVar19->data,(benchmark_problem_space *)&psview);
      }
      pbVar3 = (puVar20->_M_t).
               super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
               .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl;
      psVar5 = *(pointer *)
                ((long)&(pbVar3->_states).
                        super__Vector_base<picobench::state,_std::allocator<picobench::state>_> + 8)
      ;
      for (psVar21 = *(pointer *)
                      &(pbVar3->_states).
                       super__Vector_base<picobench::state,_std::allocator<picobench::state>_>.
                       _M_impl; psVar21 != psVar5; psVar21 = psVar21 + 1) {
        pbVar6 = *(pointer *)
                  ((long)&(pbVar19->data).
                          super__Vector_base<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
                          ._M_impl + 8);
        for (pbVar17 = (pbVar19->data).
                       super__Vector_base<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar17 != pbVar6;
            pbVar17 = pbVar17 + 1) {
          if (psVar21->_iterations == pbVar17->dimension) {
            if ((pbVar17->total_time_ns == 0) || (psVar21->_duration_ns < pbVar17->total_time_ns)) {
              pbVar17->total_time_ns = psVar21->_duration_ns;
              pbVar17->result = psVar21->_result;
            }
            if ((this->_compare_results_across_samples == true) &&
               (pbVar17->result != psVar21->_result)) {
              poVar11 = std::operator<<(this->_stderr,"Error: Two samples of ");
              poVar11 = std::operator<<(poVar11,(((puVar20->_M_t).
                                                  super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
                                                  .
                                                  super__Head_base<0UL,_picobench::benchmark_impl_*,_false>
                                                 ._M_head_impl)->super_benchmark)._name);
              poVar11 = std::operator<<(poVar11," @");
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,pbVar17->dimension);
              poVar11 = std::operator<<(poVar11," produced different results: ");
              poVar11 = std::ostream::_M_insert<long>((long)poVar11);
              poVar11 = std::operator<<(poVar11," and ");
              poVar11 = std::ostream::_M_insert<long>((long)poVar11);
              std::operator<<(poVar11,'\n');
              this->_error = error_sample_compare;
            }
            pbVar17->samples = pbVar17->samples + 1;
          }
        }
      }
      pbVar19 = pbVar19 + 1;
    }
    psVar13 = psVar13 + 1;
  }
  if (this->_compare_results_across_benchmarks != false) {
    psVar7 = (__return_storage_ptr__->suites).
             super__Vector_base<picobench::report::suite,_std::allocator<picobench::report::suite>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar13 = (__return_storage_ptr__->suites).
                   super__Vector_base<picobench::report::suite,_std::allocator<picobench::report::suite>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar13 != psVar7;
        psVar13 = psVar13 + 1) {
      report::get_problem_space_view(&psview,psVar13);
      for (p_Var12 = psview._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var12 != &psview._M_t._M_impl.super__Rb_tree_header;
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
        p_Var18 = p_Var12[1]._M_parent;
        p_Var8 = p_Var12[1]._M_left;
        if ((long)p_Var8 - (long)p_Var18 == 0x20) {
          poVar11 = std::operator<<(this->_stdwarn,"Warning: Benchmark ");
          poVar11 = std::operator<<(poVar11,*(char **)p_Var18);
          poVar11 = std::operator<<(poVar11," @");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,p_Var12[1]._M_color);
          std::operator<<(poVar11," has a single instance and cannot be compared to others.\n");
        }
        else {
          p_Var9 = p_Var18->_M_right;
          for (; p_Var18 != p_Var8; p_Var18 = p_Var18 + 1) {
            if (p_Var9 != p_Var18->_M_right) {
              p_Var10 = p_Var12[1]._M_parent;
              poVar11 = std::operator<<(this->_stderr,"Error: Benchmarks ");
              poVar11 = std::operator<<(poVar11,*(char **)p_Var10);
              poVar11 = std::operator<<(poVar11," and ");
              poVar11 = std::operator<<(poVar11,*(char **)p_Var18);
              poVar11 = std::operator<<(poVar11," @");
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,p_Var12[1]._M_color);
              poVar11 = std::operator<<(poVar11," produce different results: ");
              poVar11 = std::ostream::_M_insert<long>((long)poVar11);
              poVar11 = std::operator<<(poVar11," and ");
              poVar11 = std::ostream::_M_insert<long>((long)poVar11);
              std::operator<<(poVar11,'\n');
              this->_error = error_benchmark_compare;
            }
          }
        }
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
      ::~_Rb_tree(&psview._M_t);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

report generate_report(CompareResult cmp = std::equal_to<result_t>()) const
    {
        report rpt;

        rpt.suites.resize(_suites.size());
        auto rpt_suite = rpt.suites.begin();

        for (auto& suite : _suites)
        {
            rpt_suite->name = suite.name;

            // build benchmark view
            rpt_suite->benchmarks.resize(suite.benchmarks.size());
            auto rpt_benchmark = rpt_suite->benchmarks.begin();

            for (auto& b : suite.benchmarks)
            {
                rpt_benchmark->name = b->_name;
                rpt_benchmark->is_baseline = b->_baseline;

                const std::vector<int>& state_iterations =
                    b->_state_iterations.empty() ?
                    _default_state_iterations :
                    b->_state_iterations;

                rpt_benchmark->data.reserve(state_iterations.size());
                for (auto d : state_iterations)
                {
                    rpt_benchmark->data.push_back({ d, 0, 0ll });
                }

                for (auto& state : b->_states)
                {
                    for (auto& d : rpt_benchmark->data)
                    {
                        if (state.iterations() == d.dimension)
                        {
                            if (d.total_time_ns == 0 || d.total_time_ns > state.duration_ns())
                            {
                                d.total_time_ns = state.duration_ns();
                                d.result = state.result();
                            }

                            if (_compare_results_across_samples)
                            {
                                if (d.result != state.result() && !cmp(d.result, state.result()))
                                {
                                    *_stderr << "Error: Two samples of " << b->name() << " @" << d.dimension << " produced different results: "
                                             << d.result << " and " << state.result() << '\n';
                                    _error = error_sample_compare;
                                }
                            }

                            ++d.samples;
                        }
                    }
                }

#if defined(PICOBENCH_DEBUG)
                for (auto& d : rpt_benchmark->data)
                {
                    I_PICOBENCH_ASSERT(d.samples == b->_samples);
                }
#endif

                ++rpt_benchmark;
            }

            ++rpt_suite;
        }

        if (_compare_results_across_benchmarks)
        {
            for(auto& suite : rpt.suites)
            {
                auto psview = report::get_problem_space_view(suite);

                for (auto& space : psview)
                {
                    I_PICOBENCH_ASSERT(!space.second.empty());

                    if (space.second.size() == 1)
                    {
                        auto& b = space.second.front();
                        *_stdwarn << "Warning: Benchmark " << b.name << " @" << space.first
                                  << " has a single instance and cannot be compared to others.\n";
                        continue;
                    }

                    auto result0 = space.second.front().result;

                    for (auto& b : space.second)
                    {
                        if (result0 != b.result && !cmp(result0, b.result))
                        {
                            auto& f = space.second.front();
                            *_stderr << "Error: Benchmarks " << f.name << " and " << b.name
                                     << " @" << space.first << " produce different results: "
                                     << result0 << " and " << b.result << '\n';
                            _error = error_benchmark_compare;
                        }
                    }
                }
            }
        }

        return rpt;
    }